

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O2

void __thiscall HEkkPrimal::considerInfeasibleValueIn(HEkkPrimal *this)

{
  HighsInt *pHVar1;
  double dVar2;
  double value;
  int iVar;
  HEkk *pHVar3;
  pointer pdVar4;
  pointer pdVar5;
  double in_RAX;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double bound_shift;
  
  pHVar3 = this->ekk_instance_;
  iVar = this->variable_in;
  pdVar4 = (pHVar3->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (pHVar3->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar7 = pdVar4[iVar];
  dVar2 = pdVar5[iVar];
  value = this->value_in;
  dVar9 = dVar7 - this->primal_feasibility_tolerance;
  if (value < dVar9) {
    dVar8 = -1.0;
  }
  else {
    if (value <= this->primal_feasibility_tolerance + dVar2) {
      return;
    }
    dVar8 = 1.0;
  }
  if (this->solve_phase == 1) {
    dVar7 = (pHVar3->info_).primal_simplex_phase1_cost_perturbation_multiplier * 5e-07;
    pHVar1 = &(pHVar3->info_).num_primal_infeasibilities;
    *pHVar1 = *pHVar1 + 1;
    if ((dVar7 != 0.0) || (NAN(dVar7))) {
      dVar8 = dVar8 * (dVar7 * (pHVar3->info_).numTotRandomValue_.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start[this->row_out] + 1.0);
    }
    (pHVar3->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar] = dVar8;
    pdVar4 = (pHVar3->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4[iVar] = dVar8 + pdVar4[iVar];
  }
  else if (this->primal_correction_strategy == 0) {
    pHVar1 = &(pHVar3->info_).num_primal_infeasibilities;
    *pHVar1 = *pHVar1 + 1;
    highsLogDev(&(pHVar3->options_->super_HighsOptionsStruct).log_options,kWarning,
                "Entering variable has primal infeasibility of %g for [%g, %g, %g]\n",
                ~-(ulong)(dVar9 <= value) & (ulong)(dVar7 - value) |
                (ulong)(value - dVar2) & -(ulong)(dVar9 <= value));
    this->rebuild_reason = 8;
  }
  else {
    dVar7 = (pHVar3->info_).numTotRandomValue_.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[iVar];
    bound_shift = in_RAX;
    if (value < dVar9) {
      shiftBound(this,true,iVar,value,dVar7,pdVar4 + iVar,&bound_shift);
      lVar6 = 0x2608;
    }
    else {
      shiftBound(this,false,iVar,value,dVar7,pdVar5 + iVar,&bound_shift);
      lVar6 = 0x2620;
    }
    lVar6 = *(long *)((long)&pHVar3->callback_ + lVar6);
    *(double *)(lVar6 + (long)this->variable_in * 8) =
         bound_shift + *(double *)(lVar6 + (long)this->variable_in * 8);
    (pHVar3->info_).bounds_perturbed = true;
  }
  HEkk::invalidatePrimalMaxSumInfeasibilityRecord(this->ekk_instance_);
  return;
}

Assistant:

void HEkkPrimal::considerInfeasibleValueIn() {
  assert(row_out >= 0);
  HighsSimplexInfo& info = ekk_instance_.info_;
  // Determine the base value for cost perturbation
  const double base =
      info.primal_simplex_phase1_cost_perturbation_multiplier * 5e-7;
  const double lower = info.workLower_[variable_in];
  const double upper = info.workUpper_[variable_in];
  HighsInt bound_violated = 0;
  if (value_in < lower - primal_feasibility_tolerance) {
    bound_violated = -1;
  } else if (value_in > upper + primal_feasibility_tolerance) {
    bound_violated = 1;
  }
  if (!bound_violated) return;
  // The primal value of the entering variable is not feasible
  if (solve_phase == kSolvePhase1) {
    info.num_primal_infeasibilities++;
    double cost = bound_violated;
    if (base) cost *= 1 + base * info.numTotRandomValue_[row_out];
    info.workCost_[variable_in] = cost;
    info.workDual_[variable_in] += cost;
  } else if (primal_correction_strategy ==
             kSimplexPrimalCorrectionStrategyNone) {
    // @primal_infeasibility calculation
    double primal_infeasibility;
    if (bound_violated < 0) {
      primal_infeasibility = lower - value_in;
    } else {
      primal_infeasibility = value_in - upper;
    }
    info.num_primal_infeasibilities++;
    highsLogDev(
        ekk_instance_.options_->log_options, HighsLogType::kWarning,
        "Entering variable has primal infeasibility of %g for [%g, %g, %g]\n",
        primal_infeasibility, lower, value_in, upper);
    rebuild_reason = kRebuildReasonPrimalInfeasibleInPrimalSimplex;
  } else {
    double bound_shift;
    if (bound_violated > 0) {
      // Perturb the upper bound to accommodate the infeasibility
      shiftBound(false, variable_in, value_in,
                 info.numTotRandomValue_[variable_in],
                 info.workUpper_[variable_in], bound_shift);
      info.workUpperShift_[variable_in] += bound_shift;
    } else {
      // Perturb the lower bound to accommodate the infeasibility
      shiftBound(true, variable_in, value_in,
                 info.numTotRandomValue_[variable_in],
                 info.workLower_[variable_in], bound_shift);
      info.workLowerShift_[variable_in] += bound_shift;
    }
    info.bounds_perturbed = true;
  }
  ekk_instance_.invalidatePrimalMaxSumInfeasibilityRecord();
}